

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O2

string * __thiscall
cmUuid::ByteToHex_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar inputByte)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  long lVar4;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"  ",&local_19);
  for (lVar4 = 1; lVar4 != -1; lVar4 = lVar4 + -1) {
    pcVar1 = (char *)std::__cxx11::string::at((ulong)__return_storage_ptr__);
    bVar2 = inputByte & 0xf;
    cVar3 = bVar2 + 0x57;
    if (bVar2 < 10) {
      cVar3 = bVar2 + 0x30;
    }
    inputByte = inputByte >> 4;
    *pcVar1 = cVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::ByteToHex(unsigned char inputByte) const
{
  std::string result("  ");
  for (int i = 0; i < 2; ++i) {
    unsigned char rest = inputByte % 16;
    inputByte /= 16;
    char c = (rest < 0xA) ? static_cast<char>('0' + rest)
                          : static_cast<char>('a' + (rest - 0xA));
    result.at(1 - i) = c;
  }

  return result;
}